

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwlock-test.c
# Opt level: O1

void * stress_reader(void *arg)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  char *pcVar5;
  undefined8 uVar6;
  uint seed;
  timespec now;
  uint local_2c;
  timespec local_28;
  
  iVar1 = clock_gettime(1,&local_28);
  if (iVar1 != 0) goto LAB_001014fe;
  local_2c = (uint)local_28.tv_nsec;
  if (0 < *arg) {
    iVar1 = 0;
    do {
      uVar2 = rand_r(&local_2c);
      uVar3 = uVar2 + 7;
      if (-1 < (int)uVar2) {
        uVar3 = uVar2;
      }
      usleep((uVar2 - (uVar3 & 0x7ffffff8)) * 10 + 10);
      rwlock_lock_read(*(RWLock **)((long)arg + 8));
      lVar4 = 1;
      do {
        if (*(int *)(*(long *)((long)arg + 0x10) + lVar4 * 4) !=
            *(int *)(*(long *)((long)arg + 0x10) + -4 + lVar4 * 4) + 1) {
          pcVar5 = "stress_data->data[i] == stress_data->data[i - 1] + 1";
          uVar6 = 0x1f;
          do {
            microatf_fail_require
                      ("%s:%d: %s not met",
                       "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/rwlock-test.c"
                       ,uVar6,pcVar5);
LAB_001014fe:
            pcVar5 = "clock_gettime(CLOCK_MONOTONIC, &now) == 0";
            uVar6 = 0x16;
          } while( true );
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 != 1000);
      rwlock_unlock_read(*(RWLock **)((long)arg + 8));
      iVar1 = iVar1 + 1;
    } while (iVar1 < *arg);
  }
  return (void *)0x0;
}

Assistant:

static void *
stress_reader(void *arg)
{
	struct stress_data *stress_data = arg;
	struct timespec now;
	ATF_REQUIRE(clock_gettime(CLOCK_MONOTONIC, &now) == 0);
	unsigned int seed = (unsigned int)now.tv_nsec;

	for (int i = 0; i < stress_data->iterations; ++i) {
		usleep((useconds_t)(((rand_r(&seed) % 8) + 1) * 10));

		rwlock_lock_read(stress_data->lock);
		for (int i = 1; i < 1000; ++i) {
			ATF_REQUIRE(stress_data->data[i] ==
			    stress_data->data[i - 1] + 1);
		}
		rwlock_unlock_read(stress_data->lock);
	}

	return NULL;
}